

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serial.cc
# Opt level: O2

void __thiscall serial::Serial::setPort(Serial *this,string *port)

{
  bool bVar1;
  int __oflag;
  int __fd;
  string *psVar2;
  ScopedWriteLock wlock;
  ScopedReadLock rlock;
  ScopedWriteLock local_28;
  ScopedReadLock local_20;
  
  local_20.pimpl_ = this->pimpl_;
  psVar2 = port;
  SerialImpl::readLock(local_20.pimpl_);
  __fd = (int)psVar2;
  local_28.pimpl_ = this->pimpl_;
  SerialImpl::writeLock(local_28.pimpl_);
  bVar1 = SerialImpl::isOpen(this->pimpl_);
  if (bVar1) {
    close(this,__fd);
  }
  SerialImpl::setPort(this->pimpl_,port);
  if (bVar1) {
    open(this,(char *)port,__oflag);
  }
  ScopedWriteLock::~ScopedWriteLock(&local_28);
  ScopedReadLock::~ScopedReadLock(&local_20);
  return;
}

Assistant:

void
Serial::setPort (const string &port)
{
  ScopedReadLock rlock(this->pimpl_);
  ScopedWriteLock wlock(this->pimpl_);
  bool was_open = pimpl_->isOpen ();
  if (was_open) close();
  pimpl_->setPort (port);
  if (was_open) open ();
}